

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O1

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
gss::innards::HomomorphismSearcher::assignments_as_proof_decisions
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,HomomorphismSearcher *this,HomomorphismAssignments *assignments)

{
  pointer pHVar1;
  uint *__args_1;
  pointer pHVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHVar2 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pHVar2 != pHVar1) {
    __args_1 = &(pHVar2->assignment).target_vertex;
    do {
      if (*(char *)(__args_1 + 1) == '\x01') {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int_const&,unsigned_int_const&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,(uint *)(__args_1 + -1),__args_1);
      }
      pHVar2 = (pointer)(__args_1 + 4);
      __args_1 = __args_1 + 5;
    } while (pHVar2 != pHVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto HomomorphismSearcher::assignments_as_proof_decisions(const HomomorphismAssignments & assignments) const -> vector<pair<int, int>>
{
    vector<pair<int, int>> trail;
    for (auto & a : assignments.values)
        if (a.is_decision)
            trail.emplace_back(a.assignment.pattern_vertex, a.assignment.target_vertex);
    return trail;
}